

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-map.c
# Opt level: O2

void prt_map(void)

{
  uint uVar1;
  int iVar2;
  term *t;
  wchar_t wVar3;
  chunk_conflict *pcVar4;
  term *t_00;
  _Bool _Var5;
  int iVar6;
  int iVar7;
  int iVar8;
  loc lVar9;
  wchar_t wVar10;
  int iVar11;
  uint uVar12;
  wchar_t wVar13;
  wchar_t wVar14;
  int iVar15;
  int x;
  long lVar16;
  wchar_t local_7c;
  wchar_t tc;
  wchar_t c;
  wchar_t ta;
  wchar_t a;
  long local_60;
  grid_data g;
  
  lVar16 = 0;
  do {
    t_00 = Term;
    if (lVar16 == 8) {
      iVar11 = Term->offset_y;
      iVar7 = Term->sidebar_mode;
      local_7c = row_top_map[iVar7];
      iVar15 = Term->hgt - (row_bottom_map[iVar7] + local_7c);
      iVar8 = iVar15 / (int)(uint)tile_height + iVar11;
      uVar1 = col_map[iVar7];
      iVar7 = Term->wid;
      uVar12 = (uint)tile_width;
      iVar6 = Term->offset_x;
      wVar13 = iVar15 + local_7c;
      for (; iVar11 < iVar8; iVar11 = iVar11 + 1) {
        wVar14 = col_map[Term->sidebar_mode];
        for (iVar15 = Term->offset_x; pcVar4 = cave,
            iVar15 < (int)(~uVar1 + iVar7) / (int)uVar12 + iVar6; iVar15 = iVar15 + 1) {
          lVar9 = (loc)loc(iVar15,iVar11);
          _Var5 = square_in_bounds(pcVar4,lVar9);
          if (_Var5) {
            lVar9 = (loc)loc(iVar15,iVar11);
            map_info(lVar9,&g);
            grid_data_as_text(&g,&a,&c,&ta,&tc);
            wVar3 = a;
            wVar10 = c;
            Term_queue_char(Term,wVar14,local_7c,a,c,ta,tc);
            if ((1 < tile_width) || (1 < tile_height)) {
              Term_big_queue_char(Term,wVar14,local_7c,wVar13,wVar3,wVar10,L'\x01',L' ');
            }
          }
          wVar14 = wVar14 + (uint)tile_width;
        }
        local_7c = local_7c + (uint)tile_height;
      }
      return;
    }
    t = angband_term[lVar16];
    if (t != (term *)0x0) {
      uVar1 = window_flag[lVar16];
      if ((uVar1 & 0xa0) != 0) {
        if ((uVar1 & 0x20) == 0) {
          wVar13 = t->wid;
          iVar11 = t->hgt;
          iVar6 = wVar13 / (int)(uint)tile_width;
          wVar14 = L'\0';
          iVar7 = 0;
          if (-1 < (char)uVar1) {
            iVar7 = row_bottom_map[Term->sidebar_mode];
          }
          iVar15 = t->offset_y;
          iVar8 = iVar11 / (int)(uint)tile_height + iVar15;
          iVar2 = t->offset_x;
          local_60 = lVar16;
          for (; lVar16 = local_60, iVar15 < iVar8; iVar15 = iVar15 + 1) {
            wVar10 = L'\0';
            for (x = t->offset_x; pcVar4 = cave, x < iVar6 + iVar2; x = x + 1) {
              lVar9 = (loc)loc(x,iVar15);
              _Var5 = square_in_bounds(pcVar4,lVar9);
              if (_Var5) {
                lVar9 = (loc)loc(x,iVar15);
                map_info(lVar9,&g);
                grid_data_as_text(&g,&a,&c,&ta,&tc);
                Term_queue_char(t,wVar10,wVar14,a,c,ta,tc);
                if ((1 < tile_width) || (1 < tile_height)) {
                  wVar13 = L'ÿ';
                  wVar3 = L'\xffffffff';
LAB_001cd06c:
                  Term_big_queue_char(t,wVar10,wVar14,iVar11 - iVar7,wVar13,wVar3,L'\0',L'\0');
                }
              }
              else {
                Term_queue_char(t,wVar10,wVar14,L'\x01',L' ',L'\0',L'\0');
                if ((1 < tile_width) || (1 < tile_height)) {
                  wVar13 = L'\x01';
                  wVar3 = L' ';
                  goto LAB_001cd06c;
                }
              }
              wVar10 = wVar10 + (uint)tile_width;
            }
            for (; wVar13 = t->wid, wVar10 < wVar13; wVar10 = wVar10 + L'\x01') {
              Term_queue_char(t,wVar10,wVar14,L'\x01',L' ',L'\0',L'\0');
            }
            wVar14 = wVar14 + (uint)tile_height;
          }
          for (; wVar14 < t->hgt; wVar14 = wVar14 + L'\x01') {
            for (wVar10 = L'\0'; wVar10 < wVar13; wVar10 = wVar10 + L'\x01') {
              Term_queue_char(t,wVar10,wVar14,L'\x01',L' ',L'\0',L'\0');
              wVar13 = t->wid;
            }
          }
        }
        else {
          Term_activate(t);
          display_map((int *)0x0,(int *)0x0);
          Term_activate(t_00);
        }
      }
    }
    lVar16 = lVar16 + 1;
  } while( true );
}

Assistant:

void prt_map(void)
{
	int a, ta;
	wchar_t c, tc;
	struct grid_data g;

	int y, x;
	int vy, vx;
	int ty, tx;
	int clipy;

	/* Redraw map sub-windows */
	prt_map_aux();

	/* Assume screen */
	ty = Term->offset_y + SCREEN_HGT;
	tx = Term->offset_x + SCREEN_WID;

	/* Avoid overwriting the last row with padding for big tiles. */
	clipy = ROW_MAP + SCREEN_ROWS;

	/* Dump the map */
	for (y = Term->offset_y, vy = ROW_MAP; y < ty; vy += tile_height, y++)
		for (x = Term->offset_x, vx = COL_MAP; x < tx; vx += tile_width, x++) {
			/* Check bounds */
			if (!square_in_bounds(cave, loc(x, y))) continue;

			/* Determine what is there */
			map_info(loc(x, y), &g);
			grid_data_as_text(&g, &a, &c, &ta, &tc);

			/* Hack -- Queue it */
			Term_queue_char(Term, vx, vy, a, c, ta, tc);

			if ((tile_width > 1) || (tile_height > 1))
				Term_big_queue_char(Term, vx, vy, clipy, a, c,
					COLOUR_WHITE, L' ');
		}
}